

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

double duckdb::ApproxQuantileCoding::Encode<long,double>(long *input)

{
  double dVar1;
  long in_stack_00000030;
  
  dVar1 = Cast::Operation<long,double>(in_stack_00000030);
  return dVar1;
}

Assistant:

static SAVE_TYPE Encode(const INPUT_TYPE &input) {
		return Cast::template Operation<INPUT_TYPE, SAVE_TYPE>(input);
	}